

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

iterator * __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
begin(iterator *__return_storage_ptr__,
     IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
     *this)

{
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> GStack_88;
  
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&GStack_88,&this->source);
  iterator::iterator(__return_storage_ptr__,&GStack_88,true);
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState(&GStack_88)
  ;
  return __return_storage_ptr__;
}

Assistant:

iterator begin() { return iterator(source); }